

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir,
          cmFindBaseDebugState *debug)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference in_path;
  string *local_250;
  allocator<char> local_209;
  string local_208;
  undefined1 local_1e1;
  undefined1 local_1e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  Glob globIt;
  string glob;
  string local_128;
  undefined1 local_108 [8];
  string intPath;
  string fpath;
  string local_98 [32];
  long local_78;
  size_type pos;
  string frameWorkName;
  string fileName;
  cmFindBaseDebugState *debug_local;
  string *dir_local;
  string *file_local;
  cmFindPathCommand *this_local;
  string *fheader;
  
  std::__cxx11::string::string((string *)(frameWorkName.field_2._M_local_buf + 8),(string *)file);
  std::__cxx11::string::string((string *)&pos);
  local_78 = std::__cxx11::string::find((char)&frameWorkName + '\x18',0x2f);
  if (local_78 != -1) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)((long)&frameWorkName.field_2 + 8));
    std::__cxx11::string::operator=((string *)(frameWorkName.field_2._M_local_buf + 8),local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::operator=((string *)&pos,(string *)file);
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)((long)&fpath.field_2 + 8),(ulong)&pos);
    std::__cxx11::string::operator=((string *)&pos,(string *)(fpath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
    lVar2 = std::__cxx11::string::find((char)&pos,0x2f);
    if (lVar2 != -1) {
      std::__cxx11::string::operator=
                ((string *)(frameWorkName.field_2._M_local_buf + 8),(string *)file);
      std::__cxx11::string::clear();
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&,char_const(&)[11]>
                ((string *)((long)&intPath.field_2 + 8),dir,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                 (char (*) [11])".framework");
      cmStrCat<std::__cxx11::string&,char_const(&)[10],std::__cxx11::string&>
                ((string *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&intPath.field_2 + 8),(char (*) [10])0x1143b13,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&frameWorkName.field_2 + 8));
      bVar1 = cmsys::SystemTools::FileExists((string *)local_108);
      if (bVar1) {
        if ((this->IncludeFileInPath & 1U) == 0) {
          local_250 = (string *)((long)&intPath.field_2 + 8);
        }
        else {
          local_250 = (string *)local_108;
        }
        bVar1 = cmFindBase::Validate(&this->super_cmFindBase,local_250);
        if (!bVar1) goto LAB_006cb6b5;
        std::__cxx11::string::string((string *)&local_128);
        cmFindBaseDebugState::FoundAt(debug,(string *)local_108,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        if ((this->IncludeFileInPath & 1U) == 0) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)(intPath.field_2._M_local_buf + 8));
          bVar1 = true;
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_108);
          bVar1 = true;
        }
      }
      else {
LAB_006cb6b5:
        std::__cxx11::string::string((string *)(glob.field_2._M_local_buf + 8));
        cmFindBaseDebugState::FailedAt
                  (debug,(string *)local_108,(string *)(glob.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(glob.field_2._M_local_buf + 8));
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(intPath.field_2._M_local_buf + 8));
      if (bVar1) goto LAB_006cba1d;
    }
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string_const&>
            ((string *)&globIt.ListDirs,dir,(char (*) [21])"*.framework/Headers/",file);
  cmsys::Glob::Glob((Glob *)&files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmsys::Glob::FindFiles
            ((Glob *)&files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&globIt.ListDirs,
             (GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_
                  ((Glob *)&files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1e0,__x);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_209);
    std::allocator<char>::~allocator(&local_209);
  }
  else {
    local_1e1 = 0;
    in_path = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1e0,0);
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,in_path);
    std::__cxx11::string::string((string *)&local_208);
    cmFindBaseDebugState::FoundAt(debug,__return_storage_ptr__,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if ((this->IncludeFileInPath & 1U) == 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
    local_1e1 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0);
  cmsys::Glob::~Glob((Glob *)&files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&globIt.ListDirs);
LAB_006cba1d:
  std::__cxx11::string::~string((string *)&pos);
  std::__cxx11::string::~string((string *)(frameWorkName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(
  std::string const& file, std::string const& dir,
  cmFindBaseDebugState& debug) const
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName.clear();
    }
    if (!frameWorkName.empty()) {
      std::string fpath = cmStrCat(dir, frameWorkName, ".framework");
      std::string intPath = cmStrCat(fpath, "/Headers/", fileName);
      if (cmSystemTools::FileExists(intPath) &&
          this->Validate(this->IncludeFileInPath ? intPath : fpath)) {
        debug.FoundAt(intPath);
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
      debug.FailedAt(intPath);
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = cmStrCat(dir, "*.framework/Headers/", file);
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    debug.FoundAt(fheader);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }

  // No frameworks matched the glob, so nothing more to add to debug.FailedAt()
  return "";
}